

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cc
# Opt level: O3

ValueLimits
google::protobuf::compiler::cpp::EnumGenerator::ValueLimits::FromEnum(EnumDescriptor *descriptor)

{
  int iVar1;
  EnumValueDescriptor *pEVar2;
  EnumValueDescriptor *pEVar3;
  EnumValueDescriptor *pEVar4;
  EnumValueDescriptor *pEVar5;
  EnumValueDescriptor *pEVar6;
  long lVar7;
  EnumValueDescriptor *pEVar8;
  ValueLimits VVar9;
  
  iVar1 = descriptor->value_count_;
  if ((long)iVar1 < 1) {
    FromEnum();
  }
  pEVar3 = descriptor->values_;
  pEVar5 = pEVar3;
  if (iVar1 != 1) {
    lVar7 = (long)iVar1 + -1;
    pEVar6 = pEVar3;
    pEVar8 = pEVar3;
    pEVar2 = pEVar3;
    do {
      pEVar4 = pEVar2 + 1;
      pEVar3 = pEVar4;
      if (pEVar8->number_ <= pEVar2[1].number_) {
        pEVar3 = pEVar8;
      }
      pEVar5 = pEVar4;
      if (pEVar2[1].number_ <= pEVar6->number_) {
        pEVar5 = pEVar6;
      }
      lVar7 = lVar7 + -1;
      pEVar6 = pEVar5;
      pEVar8 = pEVar3;
      pEVar2 = pEVar4;
    } while (lVar7 != 0);
  }
  VVar9.max = pEVar5;
  VVar9.min = pEVar3;
  return VVar9;
}

Assistant:

EnumGenerator::ValueLimits EnumGenerator::ValueLimits::FromEnum(
    const EnumDescriptor* descriptor) {
  const EnumValueDescriptor* min_desc = descriptor->value(0);
  const EnumValueDescriptor* max_desc = descriptor->value(0);

  for (int i = 1; i < descriptor->value_count(); ++i) {
    if (descriptor->value(i)->number() < min_desc->number()) {
      min_desc = descriptor->value(i);
    }
    if (descriptor->value(i)->number() > max_desc->number()) {
      max_desc = descriptor->value(i);
    }
  }

  return EnumGenerator::ValueLimits{min_desc, max_desc};
}